

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorListView.cpp
# Opt level: O1

void QColorListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  NameFormat *pNVar1;
  Data *pDVar2;
  QString *pQVar3;
  qsizetype qVar4;
  NameFormat NVar5;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<QString> local_28;
  
  if (_c == WriteProperty) {
    if (_id == 1) {
      setColorNames((QColorListView *)_o,(QStringList *)*_a);
      return;
    }
    if (_id == 0) {
      setNameFormat((QColorListView *)_o,*(NameFormat *)&(((QStringList *)*_a)->d).d);
      return;
    }
  }
  else if (_c == ReadProperty) {
    pNVar1 = (NameFormat *)*_a;
    if (_id == 1) {
      colorNames((QStringList *)&local_48,(QColorListView *)_o);
      qVar4 = local_48.size;
      pQVar3 = local_48.ptr;
      pDVar2 = local_48.d;
      local_48.d = (Data *)0x0;
      local_48.ptr = (QString *)0x0;
      local_48.size = 0;
      local_28.d = *(Data **)pNVar1;
      local_28.ptr = *(QString **)(pNVar1 + 2);
      *(Data **)pNVar1 = pDVar2;
      *(QString **)(pNVar1 + 2) = pQVar3;
      local_28.size = *(qsizetype *)(pNVar1 + 4);
      *(qsizetype *)(pNVar1 + 4) = qVar4;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    }
    else if (_id == 0) {
      NVar5 = nameFormat((QColorListView *)_o);
      *pNVar1 = NVar5;
    }
  }
  return;
}

Assistant:

void QColorListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QColorListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QColorListModel::NameFormat*>(_v) = _t->nameFormat(); break;
        case 1: *reinterpret_cast< QStringList*>(_v) = _t->colorNames(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QColorListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFormat(*reinterpret_cast< QColorListModel::NameFormat*>(_v)); break;
        case 1: _t->setColorNames(*reinterpret_cast< QStringList*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}